

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O3

void mouseMotionCallback(GLFWwindow *param_1,double x,double y)

{
  if (GImGui != (ImGuiContext *)0x0) {
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0xc23,"ImGuiIO &ImGui::GetIO()");
}

Assistant:

void mouseMotionCallback(GLFWwindow* /*window*/, double x, double y)
{
    static double x0 = 0, y0 = 0;

    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureMouse)
        return;

    x0 = x;
    y0 = y;
}